

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

Image * LoadImage(Image *__return_storage_ptr__,char *fileName)

{
  char *fileType;
  Image local_38;
  uchar *local_20;
  uchar *fileData;
  char *pcStack_10;
  uint fileSize;
  char *fileName_local;
  
  pcStack_10 = fileName;
  memset(__return_storage_ptr__,0,0x18);
  fileData._4_4_ = 0;
  local_20 = LoadFileData(pcStack_10,(uint *)((long)&fileData + 4));
  if (local_20 != (uchar *)0x0) {
    fileType = GetFileExtension(pcStack_10);
    LoadImageFromMemory(&local_38,fileType,local_20,fileData._4_4_);
    __return_storage_ptr__->data = local_38.data;
    __return_storage_ptr__->width = local_38.width;
    __return_storage_ptr__->height = local_38.height;
    __return_storage_ptr__->mipmaps = local_38.mipmaps;
    __return_storage_ptr__->format = local_38.format;
    if (__return_storage_ptr__->data == (void *)0x0) {
      TraceLog(4,"IMAGE: [%s] Failed to load data",pcStack_10);
    }
    else {
      TraceLog(3,"IMAGE: [%s] Data loaded successfully (%ix%i)",pcStack_10,
               (ulong)(uint)__return_storage_ptr__->width,
               (ulong)(uint)__return_storage_ptr__->height);
    }
    free(local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Image LoadImage(const char *fileName)
{
    Image image = { 0 };

#if defined(SUPPORT_FILEFORMAT_PNG) || \
    defined(SUPPORT_FILEFORMAT_BMP) || \
    defined(SUPPORT_FILEFORMAT_TGA) || \
    defined(SUPPORT_FILEFORMAT_JPG) || \
    defined(SUPPORT_FILEFORMAT_GIF) || \
    defined(SUPPORT_FILEFORMAT_PIC) || \
    defined(SUPPORT_FILEFORMAT_HDR) || \
    defined(SUPPORT_FILEFORMAT_PSD)
#define STBI_REQUIRED
#endif

    // Loading file to memory
    unsigned int fileSize = 0;
    unsigned char *fileData = LoadFileData(fileName, &fileSize);

    if (fileData != NULL)
    {
        // Loading image from memory data
        image = LoadImageFromMemory(GetFileExtension(fileName), fileData, fileSize);

        if (image.data != NULL) TRACELOG(LOG_INFO, "IMAGE: [%s] Data loaded successfully (%ix%i)", fileName, image.width, image.height);
        else TRACELOG(LOG_WARNING, "IMAGE: [%s] Failed to load data", fileName);

        RL_FREE(fileData);
    }

    return image;
}